

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O3

int dsa_cmp_parameters(EVP_PKEY *a,EVP_PKEY *b)

{
  DSA *dsa;
  DSA *dsa_00;
  int iVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  uint uVar4;
  
  dsa = (DSA *)a->pkey;
  dsa_00 = (DSA *)b->pkey;
  pBVar2 = (BIGNUM *)DSA_get0_p(dsa);
  pBVar3 = (BIGNUM *)DSA_get0_p(dsa_00);
  iVar1 = BN_cmp(pBVar2,pBVar3);
  uVar4 = 0;
  if (iVar1 == 0) {
    pBVar2 = (BIGNUM *)DSA_get0_q(dsa);
    pBVar3 = (BIGNUM *)DSA_get0_q(dsa_00);
    iVar1 = BN_cmp(pBVar2,pBVar3);
    if (iVar1 == 0) {
      pBVar2 = (BIGNUM *)DSA_get0_g(dsa);
      pBVar3 = (BIGNUM *)DSA_get0_g(dsa_00);
      iVar1 = BN_cmp(pBVar2,pBVar3);
      uVar4 = (uint)(iVar1 == 0);
    }
  }
  return uVar4;
}

Assistant:

static int dsa_cmp_parameters(const EVP_PKEY *a, const EVP_PKEY *b) {
  const DSA *a_dsa = reinterpret_cast<const DSA *>(a->pkey);
  const DSA *b_dsa = reinterpret_cast<const DSA *>(b->pkey);
  return BN_cmp(DSA_get0_p(a_dsa), DSA_get0_p(b_dsa)) == 0 &&
         BN_cmp(DSA_get0_q(a_dsa), DSA_get0_q(b_dsa)) == 0 &&
         BN_cmp(DSA_get0_g(a_dsa), DSA_get0_g(b_dsa)) == 0;
}